

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

ArgMaxLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::ArgMaxLayerParams>
          (Arena *arena)

{
  ArgMaxLayerParams *pAVar1;
  
  if (arena != (Arena *)0x0) {
    pAVar1 = DoCreateMessage<CoreML::Specification::ArgMaxLayerParams>(arena);
    return pAVar1;
  }
  pAVar1 = (ArgMaxLayerParams *)operator_new(0x20);
  CoreML::Specification::ArgMaxLayerParams::ArgMaxLayerParams(pAVar1,(Arena *)0x0,false);
  return pAVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }